

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *args_1;
  IffEventClauseSyntax *args;
  SignalEventExpressionSyntax *pSVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  IffEventClauseSyntax *in_stack_ffffffffffffffc0;
  BumpAllocator *this;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  this = TVar2._0_8_;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x289a53);
  args_1 = deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(__fn + 0x30) == 0) {
    args = (IffEventClauseSyntax *)0x0;
  }
  else {
    args = deepClone<slang::syntax::IffEventClauseSyntax>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SignalEventExpressionSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::IffEventClauseSyntax*>
                     (this,(Token *)args,args_1,(IffEventClauseSyntax **)__child_stack);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SignalEventExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SignalEventExpressionSyntax>(
        node.edge.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.iffClause ? deepClone(*node.iffClause, alloc) : nullptr
    );
}